

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>::SharedPtr
          (SharedPtr<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection> *this,
          UniformCollection *ptr)

{
  UniformCollection *pUVar1;
  SharedPtrState<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection,_de::DefaultDeleter<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>_>
  *pSVar2;
  DefaultDeleter<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>
  local_25 [13];
  UniformCollection *local_18;
  UniformCollection *ptr_local;
  SharedPtr<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection> *this_local;
  
  this->m_ptr = (UniformCollection *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (UniformCollection *)this;
  pSVar2 = (SharedPtrState<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection,_de::DefaultDeleter<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>_>
            *)operator_new(0x20);
  pUVar1 = local_18;
  DefaultDeleter<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>::
  DefaultDeleter(local_25);
  SharedPtrState<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection,_de::DefaultDeleter<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>_>
  ::SharedPtrState(pSVar2,pUVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}